

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_allocator.cpp
# Opt level: O1

void __thiscall
duckdb::TupleDataBlock::TupleDataBlock
          (TupleDataBlock *this,BufferManager *buffer_manager,idx_t capacity_p)

{
  BufferHandle buffer_handle;
  BufferHandle BStack_28;
  
  (this->handle).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->handle).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->capacity = capacity_p;
  this->size = 0;
  (*buffer_manager->_vptr_BufferManager[4])(&BStack_28,buffer_manager,1,capacity_p,0);
  shared_ptr<duckdb::BlockHandle,_true>::operator=(&this->handle,&BStack_28.handle);
  BufferHandle::~BufferHandle(&BStack_28);
  return;
}

Assistant:

TupleDataBlock::TupleDataBlock(BufferManager &buffer_manager, idx_t capacity_p) : capacity(capacity_p), size(0) {
	auto buffer_handle = buffer_manager.Allocate(MemoryTag::HASH_TABLE, capacity, false);
	handle = buffer_handle.GetBlockHandle();
}